

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall QDataWidgetMapper::clearMapping(QDataWidgetMapper *this)

{
  long lVar1;
  pointer pWVar2;
  Data *pDVar3;
  QObject *pQVar4;
  const_reverse_iterator end;
  const_reverse_iterator it;
  pointer pWVar5;
  long in_FS_OFFSET;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  pWVar2 = *(pointer *)(lVar1 + 0xa0);
  pWVar5 = *(pointer *)(lVar1 + 0xa8);
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0xb0);
  *(undefined8 *)(lVar1 + 0xa0) = 0;
  *(undefined8 *)(lVar1 + 0xa8) = 0;
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_start = pWVar2;
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_finish = pWVar5;
  for (; pWVar5 != pWVar2; pWVar5 = pWVar5 + -1) {
    pDVar3 = pWVar5[-1].widget.wp.d;
    if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
       (pQVar4 = pWVar5[-1].widget.wp.value, pQVar4 != (QObject *)0x0)) {
      QObject::removeEventFilter(pQVar4);
    }
  }
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::~vector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::clearMapping()
{
    Q_D(QDataWidgetMapper);

    decltype(d->widgetMap) copy;
    d->widgetMap.swap(copy); // a C++98 move
    for (auto it = copy.crbegin(), end = copy.crend(); it != end; ++it) {
        if (it->widget)
            it->widget->removeEventFilter(d->delegate);
    }
}